

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

bool __thiscall wasm::EffectAnalyzer::hasNonTrapSideEffects(EffectAnalyzer *this)

{
  bool bVar1;
  undefined1 uVar2;
  
  uVar2 = 1;
  if (((this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
     (this->danglingPop == false)) {
    bVar1 = writesGlobalState(this);
    if ((!bVar1) &&
       ((this->throws_ == false &&
        ((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      bVar1 = transfersControlFlow(this);
      if (!bVar1) {
        uVar2 = this->mayNotReturn;
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool hasNonTrapSideEffects() const {
    return localsWritten.size() > 0 || danglingPop || writesGlobalState() ||
           throws() || transfersControlFlow() || mayNotReturn;
  }